

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O0

EVP_PKEY_CTX * EVP_PKEY_CTX_new_id(int id,ENGINE *e)

{
  EVP_PKEY_METHOD *pmeth;
  EVP_PKEY_METHOD *pkey_method;
  ENGINE *e_local;
  EVP_PKEY_CTX *pEStack_10;
  int id_local;
  
  pmeth = evp_pkey_meth_find(id);
  if (pmeth == (EVP_PKEY_METHOD *)0x0) {
    ERR_put_error(6,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x59);
    ERR_add_error_dataf("algorithm %d",(ulong)(uint)id);
    pEStack_10 = (EVP_PKEY_CTX *)0x0;
  }
  else {
    pEStack_10 = evp_pkey_ctx_new((EVP_PKEY *)0x0,(ENGINE *)e,pmeth);
  }
  return (EVP_PKEY_CTX *)pEStack_10;
}

Assistant:

EVP_PKEY_CTX *EVP_PKEY_CTX_new_id(int id, ENGINE *e) {
  const EVP_PKEY_METHOD *pkey_method = evp_pkey_meth_find(id);
  if (pkey_method == NULL) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
    ERR_add_error_dataf("algorithm %d", id);
    return NULL;
  }

  return evp_pkey_ctx_new(NULL, e, pkey_method);
}